

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

void __thiscall icu_63::SimpleTimeZone::decodeEndRule(SimpleTimeZone *this,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  UErrorCode *status_local;
  SimpleTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    bVar2 = false;
    if (this->startDay != '\0') {
      bVar2 = this->endDay != '\0';
    }
    this->useDaylight = bVar2;
    if ((this->useDaylight != '\0') && (this->dstSavings == 0)) {
      this->dstSavings = 3600000;
    }
    if (this->endDay != '\0') {
      if ((this->endMonth < '\0') || ('\v' < this->endMonth)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else if ((((this->endTime < 0) || (86400000 < this->endTime)) || ((int)this->endTimeMode < 0))
              || (2 < (int)this->endTimeMode)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        if (this->endDayOfWeek == '\0') {
          this->endMode = DOM_MODE;
        }
        else {
          if (this->endDayOfWeek < '\x01') {
            this->endDayOfWeek = -this->endDayOfWeek;
            if (this->endDay < '\x01') {
              this->endDay = -this->endDay;
              this->endMode = DOW_LE_DOM_MODE;
            }
            else {
              this->endMode = DOW_GE_DOM_MODE;
            }
          }
          else {
            this->endMode = DOW_IN_MONTH_MODE;
          }
          if ('\a' < this->endDayOfWeek) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
          }
        }
        if (this->endMode == DOW_IN_MONTH_MODE) {
          if ((this->endDay < -5) || ('\x05' < this->endDay)) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
          }
        }
        else if ((this->endDay < '\x01') || ((char)STATICMONTHLENGTH[this->endMonth] < this->endDay)
                ) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
      }
    }
  }
  return;
}

Assistant:

void 
SimpleTimeZone::decodeEndRule(UErrorCode& status) 
{
    if(U_FAILURE(status)) return;

    useDaylight = (UBool)((startDay != 0) && (endDay != 0) ? TRUE : FALSE);
    if (useDaylight && dstSavings == 0) {
        dstSavings = U_MILLIS_PER_HOUR;
    }
    if (endDay != 0) {
        if (endMonth < UCAL_JANUARY || endMonth > UCAL_DECEMBER) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        if (endTime < 0 || endTime > U_MILLIS_PER_DAY ||
            endTimeMode < WALL_TIME || endTimeMode > UTC_TIME) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        if (endDayOfWeek == 0) {
            endMode = DOM_MODE;
        } else {
            if (endDayOfWeek > 0) {
                endMode = DOW_IN_MONTH_MODE;
            } else {
                endDayOfWeek = (int8_t)-endDayOfWeek;
                if (endDay > 0) {
                    endMode = DOW_GE_DOM_MODE;
                } else {
                    endDay = (int8_t)-endDay;
                    endMode = DOW_LE_DOM_MODE;
                }
            }
            if (endDayOfWeek > UCAL_SATURDAY) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
                return;
            }
        }
        if (endMode == DOW_IN_MONTH_MODE) {
            if (endDay < -5 || endDay > 5) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
                return;
            }
        } else if (endDay<1 || endDay > STATICMONTHLENGTH[endMonth]) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
    }
}